

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c
# Opt level: O3

void emit_loop(ch_compilation *comp,ch_jmpptr offset)

{
  ch_emit_scope *pcVar1;
  undefined8 in_RAX;
  int iVar2;
  ch_op op;
  uint8_t le_value [4];
  undefined4 local_28;
  undefined4 local_24;
  
  _local_28 = CONCAT44((int)((ulong)in_RAX >> 0x20),0x1e);
  ch_emit_write(&((comp->emit).emit_scope)->bytecode,&local_28,1);
  ch_uint32_to_le_array(0,(uint8_t *)&local_24);
  ch_emit_write(&((comp->emit).emit_scope)->bytecode,&local_24,4);
  pcVar1 = (comp->emit).emit_scope;
  iVar2 = *(int *)&(pcVar1->bytecode).current - *(int *)&(pcVar1->bytecode).start;
  ch_emit_patch_ptr(&comp->emit,offset - iVar2,iVar2 + -4);
  return;
}

Assistant:

void emit_loop(ch_compilation *comp, ch_jmpptr offset) {
  EMIT_OP(GET_EMIT(comp), OP_JMP);
  EMIT_PTR(GET_EMIT(comp), 0);

  ch_blob* bytecode = &GET_EMIT(comp)->emit_scope->bytecode;
  ch_jmpptr current = CH_BLOB_CONTENT_SIZE(bytecode);
  ch_jmpptr real_offset = (current - offset);

  ch_emit_patch_ptr(GET_EMIT(comp), -real_offset, current - sizeof(ch_jmpptr));
}